

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

int matchone(regex_t p,char c)

{
  int iVar1;
  char c_local;
  regex_t p_local;
  
  switch(p.type) {
  case '\x01':
    p_local.u._4_4_ = matchdot(c);
    break;
  default:
    p_local.type = p.u._0_1_;
    p_local.u._4_4_ = ZEXT14((uint)p_local.type == (int)c);
    break;
  case '\b':
    p_local.u._4_4_ = matchcharclass(c,(char *)p.u.ccl);
    break;
  case '\t':
    iVar1 = matchcharclass(c,(char *)p.u.ccl);
    p_local.u._4_4_ = ZEXT14((iVar1 != 0 ^ 0xffU) & 1);
    break;
  case '\n':
    p_local.u._4_4_ = matchdigit(c);
    break;
  case '\v':
    iVar1 = matchdigit(c);
    p_local.u._4_4_ = ZEXT14((iVar1 != 0 ^ 0xffU) & 1);
    break;
  case '\f':
    p_local.u._4_4_ = matchalphanum(c);
    break;
  case '\r':
    iVar1 = matchalphanum(c);
    p_local.u._4_4_ = ZEXT14((iVar1 != 0 ^ 0xffU) & 1);
    break;
  case '\x0e':
    p_local.u._4_4_ = matchwhitespace(c);
    break;
  case '\x0f':
    iVar1 = matchwhitespace(c);
    p_local.u._4_4_ = ZEXT14((iVar1 != 0 ^ 0xffU) & 1);
  }
  return p_local.u._4_4_;
}

Assistant:

static int matchone(regex_t p, char c)
{
  switch (p.type)
  {
    case DOT:            return matchdot(c);
    case CHAR_CLASS:     return  matchcharclass(c, (const char*)p.u.ccl);
    case INV_CHAR_CLASS: return !matchcharclass(c, (const char*)p.u.ccl);
    case DIGIT:          return  matchdigit(c);
    case NOT_DIGIT:      return !matchdigit(c);
    case ALPHA:          return  matchalphanum(c);
    case NOT_ALPHA:      return !matchalphanum(c);
    case WHITESPACE:     return  matchwhitespace(c);
    case NOT_WHITESPACE: return !matchwhitespace(c);
    default:             return  (p.u.ch == c);
  }
}